

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O3

void icu_63::number::impl::blueprint_helpers::parseFractionStem
               (StringSegment *segment,MacroProps *macros,UErrorCode *status)

{
  FractionSignificantSettings FVar1;
  char16_t cVar2;
  int32_t iVar3;
  int iVar4;
  int minFractionPlaces;
  int maxFractionPlaces;
  Precision local_50;
  
  iVar3 = numparse::impl::StringSegment::length(segment);
  if (iVar3 < 2) {
    minFractionPlaces = 0;
    iVar4 = 1;
  }
  else {
    iVar4 = 0;
    do {
      minFractionPlaces = iVar4;
      iVar4 = minFractionPlaces + 1;
      cVar2 = numparse::impl::StringSegment::charAt(segment,iVar4);
      if (cVar2 != L'0') goto LAB_0026bd60;
      iVar3 = numparse::impl::StringSegment::length(segment);
      iVar4 = minFractionPlaces + 1;
    } while (minFractionPlaces + 2 < iVar3);
    iVar4 = minFractionPlaces + 2;
    minFractionPlaces = minFractionPlaces + 1;
  }
LAB_0026bd60:
  iVar3 = numparse::impl::StringSegment::length(segment);
  maxFractionPlaces = minFractionPlaces;
  if (iVar4 < iVar3) {
    cVar2 = numparse::impl::StringSegment::charAt(segment,iVar4);
    if (cVar2 == L'+') {
      iVar3 = numparse::impl::StringSegment::length(segment);
      if (iVar4 + 1 < iVar3) goto LAB_0026bddd;
      Precision::minFraction((FractionPrecision *)&local_50,minFractionPlaces);
      goto LAB_0026bdf9;
    }
    iVar3 = numparse::impl::StringSegment::length(segment);
    if (iVar4 < iVar3) {
      do {
        cVar2 = numparse::impl::StringSegment::charAt(segment,iVar4);
        if (cVar2 != L'#') break;
        maxFractionPlaces = maxFractionPlaces + 1;
        iVar4 = iVar4 + 1;
        iVar3 = numparse::impl::StringSegment::length(segment);
      } while (iVar4 < iVar3);
    }
  }
  iVar3 = numparse::impl::StringSegment::length(segment);
  if (iVar4 < iVar3) {
LAB_0026bddd:
    *status = U_NUMBER_SKELETON_SYNTAX_ERROR;
    return;
  }
  Precision::minMaxFraction(minFractionPlaces,maxFractionPlaces);
LAB_0026bdf9:
  FVar1.fMinSig = local_50.fUnion.fracSig.fMinSig;
  FVar1.fMaxSig = local_50.fUnion.fracSig.fMaxSig;
  FVar1.fMinFrac = local_50.fUnion.fracSig.fMinFrac;
  FVar1.fMaxFrac = local_50.fUnion.fracSig.fMaxFrac;
  *(ulong *)((long)&(macros->precision).fUnion.increment.fIncrement + 4) =
       CONCAT44(local_50.fUnion._8_4_,local_50.fUnion._4_4_);
  *(undefined8 *)((long)&(macros->precision).fUnion + 0xc) = local_50._20_8_;
  (macros->precision).fType = local_50.fType;
  *(undefined4 *)&(macros->precision).field_0x4 = local_50._4_4_;
  (macros->precision).fUnion.fracSig = FVar1;
  return;
}

Assistant:

void blueprint_helpers::parseFractionStem(const StringSegment& segment, MacroProps& macros,
                                          UErrorCode& status) {
    U_ASSERT(segment.charAt(0) == u'.');
    int32_t offset = 1;
    int32_t minFrac = 0;
    int32_t maxFrac;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'0') {
            minFrac++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        if (segment.charAt(offset) == u'+') {
            maxFrac = -1;
            offset++;
        } else {
            maxFrac = minFrac;
            for (; offset < segment.length(); offset++) {
                if (segment.charAt(offset) == u'#') {
                    maxFrac++;
                } else {
                    break;
                }
            }
        }
    } else {
        maxFrac = minFrac;
    }
    if (offset < segment.length()) {
        // throw new SkeletonSyntaxException("Invalid fraction stem", segment);
        status = U_NUMBER_SKELETON_SYNTAX_ERROR;
        return;
    }
    // Use the public APIs to enforce bounds checking
    if (maxFrac == -1) {
        macros.precision = Precision::minFraction(minFrac);
    } else {
        macros.precision = Precision::minMaxFraction(minFrac, maxFrac);
    }
}